

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

BOOL Js::JavascriptObject::GetOwnPropertyDescriptorHelper
               (RecyclableObject *obj,PropertyId propertyId,ScriptContext *scriptContext,
               PropertyDescriptor *propertyDescriptor)

{
  BOOL BVar1;
  int iVar2;
  
  BVar1 = RecyclableObject::IsExternal(obj);
  if (BVar1 != 0) {
    iVar2 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)(uint)propertyId);
    if (iVar2 == 0) {
      return 0;
    }
  }
  BVar1 = JavascriptOperators::GetOwnPropertyDescriptor
                    (obj,propertyId,scriptContext,propertyDescriptor);
  return BVar1;
}

Assistant:

BOOL JavascriptObject::GetOwnPropertyDescriptorHelper(RecyclableObject* obj, PropertyId propertyId, ScriptContext* scriptContext, PropertyDescriptor& propertyDescriptor)
{
    BOOL isPropertyDescriptorDefined;
    if (obj->IsExternal())
    {
        isPropertyDescriptorDefined = obj->HasOwnProperty(propertyId) ?
            JavascriptOperators::GetOwnPropertyDescriptor(obj, propertyId, scriptContext, &propertyDescriptor) :
            FALSE;
    }
    else
    {
        isPropertyDescriptorDefined = JavascriptOperators::GetOwnPropertyDescriptor(obj, propertyId, scriptContext, &propertyDescriptor);
    }
    return isPropertyDescriptorDefined;
}